

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseConversion.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
OpenMD::toUpperCopy<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cont,locale *param_2)

{
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  locale *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  locale local_28 [15];
  undefined1 local_19;
  
  local_19 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  std::locale::locale(local_28);
  toUpper<std::__cxx11::string>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::locale::~locale(local_28);
  return in_RDI;
}

Assistant:

Container toUpperCopy(const Container& cont,
                        const std::locale& = std::locale()) {
    Container result {cont};
    toUpper(result);

    return result;
  }